

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O0

void __thiscall
duckdb::QuantileCursor<duckdb::hugeint_t>::QuantileCursor
          (QuantileCursor<duckdb::hugeint_t> *this,WindowPartitionInput *partition)

{
  const_reference cVar1;
  long in_RSI;
  undefined8 *in_RDI;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  ColumnDataScanState *in_stack_ffffffffffffffa0;
  vector<bool,_true> *this_00;
  undefined1 local_38 [56];
  
  *in_RDI = *(undefined8 *)(in_RSI + 8);
  ColumnDataScanState::ColumnDataScanState(in_stack_ffffffffffffffa0);
  duckdb::DataChunk::DataChunk((DataChunk *)(in_RDI + 0x11));
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  this_00 = (vector<bool,_true> *)*in_RDI;
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)this_00,
             (vector<unsigned_long,_true> *)
             CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  duckdb::ColumnDataCollection::InitializeScan(this_00,in_RDI + 1,local_38,1);
  vector<unsigned_long,_true>::~vector((vector<unsigned_long,_true> *)0xa2aef0);
  duckdb::ColumnDataCollection::InitializeScanChunk
            ((ColumnDataScanState *)*in_RDI,(DataChunk *)(in_RDI + 1));
  cVar1 = vector<bool,_true>::operator[]
                    (this_00,CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  *(const_reference *)(in_RDI + 0x1b) = cVar1;
  return;
}

Assistant:

explicit QuantileCursor(const WindowPartitionInput &partition) : inputs(*partition.inputs) {
		D_ASSERT(partition.column_ids.size() == 1);
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, page);

		D_ASSERT(partition.all_valid.size() == 1);
		all_valid = partition.all_valid[0];
	}